

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmaker.cpp
# Opt level: O3

void __thiscall banksia::JsonMaker::JsonMaker(JsonMaker *this)

{
  *(undefined8 *)((long)&(this->super_Tickable).tickMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_Tickable).tickMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_Tickable).tickMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_Tickable).tickMutex.super___mutex_base._M_mutex + 8) = 0;
  (this->super_Tickable).tickMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->super_Obj)._vptr_Obj = (_func_int **)&PTR__JsonMaker_001c0880;
  (this->super_Tickable)._vptr_Tickable = (_func_int **)&PTR__JsonMaker_001c08c8;
  (this->defaultJsonTourName)._M_dataplus._M_p = (pointer)&(this->defaultJsonTourName).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->defaultJsonTourName,"tour.json","");
  (this->defaultJsonEngineName)._M_dataplus._M_p = (pointer)&(this->defaultJsonEngineName).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->defaultJsonEngineName,"engines.json","");
  this->state = begin;
  this->tick_idle_max = 600;
  this->concurrency = 4;
  *(undefined8 *)&this->tick_idle = 0;
  *(undefined8 *)
   ((long)&(this->configVec).super__Vector_base<banksia::Config,_std::allocator<banksia::Config>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->configVec).super__Vector_base<banksia::Config,_std::allocator<banksia::Config>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->configVec).super__Vector_base<banksia::Config,_std::allocator<banksia::Config>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->workingEngineVec).
           super__Vector_base<banksia::JsonEngine_*,_std::allocator<banksia::JsonEngine_*>_>._M_impl
           .super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->workingEngineVec).
           super__Vector_base<banksia::JsonEngine_*,_std::allocator<banksia::JsonEngine_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->workingEngineVec).
           super__Vector_base<banksia::JsonEngine_*,_std::allocator<banksia::JsonEngine_*>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->goodConfigVec).
           super__Vector_base<banksia::Config,_std::allocator<banksia::Config>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->goodConfigVec).super__Vector_base<banksia::Config,_std::allocator<banksia::Config>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->goodConfigVec).super__Vector_base<banksia::Config,_std::allocator<banksia::Config>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CppTime::Timer::Timer(&this->timer);
  (this->jsonTourMngPath)._M_dataplus._M_p = (pointer)&(this->jsonTourMngPath).field_2;
  (this->jsonTourMngPath)._M_string_length = 0;
  (this->jsonTourMngPath).field_2._M_local_buf[0] = '\0';
  (this->jsonEngineConfigPath)._M_dataplus._M_p = (pointer)&(this->jsonEngineConfigPath).field_2;
  (this->jsonEngineConfigPath)._M_string_length = 0;
  (this->jsonEngineConfigPath).field_2._M_local_buf[0] = '\0';
  (this->motherEngineFolder)._M_dataplus._M_p = (pointer)&(this->motherEngineFolder).field_2;
  (this->motherEngineFolder)._M_string_length = 0;
  (this->motherEngineFolder).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

JsonMaker::JsonMaker()
{
}